

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void neg256(uint16_t *out,uint16_t *a)

{
  uint uVar1;
  uint32_t carry;
  int i;
  uint16_t *a_local;
  uint16_t *out_local;
  
  carry = 1;
  for (i = 0; i < 0x10; i = i + 1) {
    uVar1 = (a[i] ^ 0xffff) + carry;
    out[i] = (uint16_t)uVar1;
    carry = uVar1 >> 0x10;
  }
  return;
}

Assistant:

static void neg256(uint16_t* out, const uint16_t* a) {
    int i;
    uint32_t carry = 1;
    for (i = 0; i < 16; ++i) {
        carry += (uint16_t)~a[i];
        out[i] = carry;
        carry >>= 16;
    }
}